

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void QPDFJob::parse_object_id(string *objspec,bool *trailer,int *obj,int *gen)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  string local_50 [32];
  long local_30;
  size_t comma;
  int *gen_local;
  int *obj_local;
  bool *trailer_local;
  string *objspec_local;
  
  comma = (size_t)gen;
  gen_local = obj;
  obj_local = (int *)trailer;
  trailer_local = (bool *)objspec;
  bVar1 = std::operator==(objspec,"trailer");
  if (bVar1) {
    *(undefined1 *)obj_local = 1;
  }
  else {
    *(undefined1 *)obj_local = 0;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = QUtil::string_to_int(pcVar3);
    *gen_local = iVar2;
    local_30 = std::__cxx11::string::find((char)trailer_local,0x2c);
    if ((local_30 != -1) &&
       (uVar4 = local_30 + 1, uVar5 = std::__cxx11::string::length(), uVar4 < uVar5)) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)trailer_local);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = QUtil::string_to_int(pcVar3);
      *(int *)comma = iVar2;
      std::__cxx11::string::~string(local_50);
    }
  }
  return;
}

Assistant:

void
QPDFJob::parse_object_id(std::string const& objspec, bool& trailer, int& obj, int& gen)
{
    if (objspec == "trailer") {
        trailer = true;
    } else {
        trailer = false;
        obj = QUtil::string_to_int(objspec.c_str());
        size_t comma = objspec.find(',');
        if ((comma != std::string::npos) && (comma + 1 < objspec.length())) {
            gen = QUtil::string_to_int(objspec.substr(1 + comma, std::string::npos).c_str());
        }
    }
}